

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O3

void p2sc_spawn_many(char **cmd,int num)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *fmt;
  ulong uVar5;
  int status;
  GError *err;
  int local_44;
  ulong local_40;
  gint argc;
  
  err = (GError *)0x0;
  lVar3 = g_malloc((long)num * 4);
  if (0 < num) {
    lVar4 = 0;
    local_44 = num;
    local_40 = (ulong)(uint)num;
    do {
      iVar2 = g_shell_parse_argv(*(undefined8 *)((long)cmd + lVar4 * 2),&argc,&status,&err);
      if (iVar2 == 0) {
        if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
          fmt = "shell_parse_argv(%s): unknown failure";
          iVar2 = 0xc1;
        }
        else {
          fmt = "shell_parse_argv(%s): %s";
          iVar2 = 0xbe;
        }
LAB_0010bb5a:
        _p2sc_msg("p2sc_spawn_many",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                  ,iVar2,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,fmt,
                  *(undefined8 *)((long)cmd + lVar4 * 2));
        exit(1);
      }
      iVar2 = g_spawn_async(0,_status,0,0x1e,0,0,lVar3 + lVar4,&err);
      if (iVar2 == 0) {
        if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
          fmt = "spawn_aync(%s): unknown failure";
          iVar2 = 0xcd;
        }
        else {
          fmt = "spawn_async(%s): %s";
          iVar2 = 0xca;
        }
        goto LAB_0010bb5a;
      }
      g_strfreev(_status);
      uVar1 = local_40;
      lVar4 = lVar4 + 4;
    } while ((ulong)(uint)num * 4 - lVar4 != 0);
    if (0 < local_44) {
      uVar5 = 0;
      do {
        waitpid(*(__pid_t *)(lVar3 + uVar5 * 4),&status,0);
        g_spawn_close_pid(*(undefined4 *)(lVar3 + uVar5 * 4));
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  g_free(lVar3);
  return;
}

Assistant:

void p2sc_spawn_many(const char **cmd, int num) {
    int i, status;
    GError *err = NULL;
    GPid *pid = (GPid *) g_malloc(num * sizeof *pid);

    for (i = 0; i < num; ++i) {
        gint argc;
        gchar **argv;

        if (!g_shell_parse_argv(cmd[i], &argc, &argv, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "shell_parse_argv(%s): unknown failure", cmd[i]);
        }

        if (!g_spawn_async(NULL, argv, NULL,
                           (GSpawnFlags) (G_SPAWN_SEARCH_PATH |
                                          G_SPAWN_STDOUT_TO_DEV_NULL |
                                          G_SPAWN_STDERR_TO_DEV_NULL |
                                          G_SPAWN_DO_NOT_REAP_CHILD), NULL, NULL, pid + i, &err)) {
            if (err && err->message) {
                P2SC_Msg(LVL_FATAL, "spawn_async(%s): %s", cmd[i], err->message);
                g_error_free(err);
            } else
                P2SC_Msg(LVL_FATAL, "spawn_aync(%s): unknown failure", cmd[i]);
        }

        g_strfreev(argv);
    }
    /* wait for our children */
    for (i = 0; i < num; ++i) {
        waitpid(pid[i], &status, 0);
        g_spawn_close_pid(pid[i]);
    }

    g_free(pid);
}